

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::PaddingLayerParams::set_allocated_reflection
          (PaddingLayerParams *this,PaddingLayerParams_PaddingReflection *reflection)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_PaddingType(this);
  if (reflection != (PaddingLayerParams_PaddingReflection *)0x0) {
    submessage_arena = (Arena *)(reflection->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 2) == 0) {
      if (((ulong)submessage_arena & 1) != 0) {
        submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffc);
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      reflection = (PaddingLayerParams_PaddingReflection *)
                   google::protobuf::internal::GetOwnedMessageInternal
                             (message_arena,&reflection->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 2;
    (this->PaddingType_).reflection_ = reflection;
  }
  return;
}

Assistant:

void PaddingLayerParams::set_allocated_reflection(::CoreML::Specification::PaddingLayerParams_PaddingReflection* reflection) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_PaddingType();
  if (reflection) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::PaddingLayerParams_PaddingReflection>::GetOwningArena(reflection);
    if (message_arena != submessage_arena) {
      reflection = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, reflection, submessage_arena);
    }
    set_has_reflection();
    PaddingType_.reflection_ = reflection;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.PaddingLayerParams.reflection)
}